

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

ssize_t tnt_io_flush(tnt_stream_net *s)

{
  ssize_t rc;
  tnt_stream_net *s_local;
  
  if ((s->sbuf).off == 0) {
    s_local = (tnt_stream_net *)0x0;
  }
  else {
    s_local = (tnt_stream_net *)tnt_io_send_raw(s,(s->sbuf).buf,(s->sbuf).off,1);
    if (s_local == (tnt_stream_net *)0xffffffffffffffff) {
      s_local = (tnt_stream_net *)0xffffffffffffffff;
    }
    else {
      (s->sbuf).off = 0;
    }
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t tnt_io_flush(struct tnt_stream_net *s) {
	if (s->sbuf.off == 0)
		return 0;
	ssize_t rc = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (rc == -1)
		return -1;
	s->sbuf.off = 0;
	return rc;
}